

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReparserTester.cpp
# Opt level: O2

void __thiscall psy::C::ReparserTester::case0027(ReparserTester *this)

{
  Expectation *pEVar1;
  initializer_list<psy::C::SyntaxKind> __l;
  allocator<char> local_21b;
  allocator_type local_21a;
  allocator<char> local_219;
  _Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_218;
  _Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_200;
  string local_1e8;
  string local_1c8;
  SyntaxKind local_1a8 [20];
  Expectation local_180;
  Expectation local_c8;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"\nint _ ( )\n{\n    x y ;\n    x * z ;\n    x . m ;\n}\n",
             &local_219);
  Expectation::Expectation(&local_180);
  local_1a8[8] = PointerDeclarator;
  local_1a8[9] = IdentifierDeclarator;
  local_1a8[10] = ExpressionStatement;
  local_1a8[0xb] = MultiplyExpression;
  local_1a8[0xc] = IdentifierName;
  local_1a8[0xd] = IdentifierName;
  local_1a8[0xe] = ExpressionStatement;
  local_1a8[0xf] = DirectMemberAccessExpression;
  local_1a8[0] = DeclarationStatement;
  local_1a8[1] = VariableAndOrFunctionDeclaration;
  local_1a8[2] = TypedefName;
  local_1a8[3] = IdentifierDeclarator;
  local_1a8[4] = AmbiguousMultiplicationOrPointerDeclaration;
  local_1a8[5] = DeclarationStatement;
  local_1a8[6] = VariableAndOrFunctionDeclaration;
  local_1a8[7] = TypedefName;
  local_1a8[0x10] = IdentifierName;
  local_1a8[0x11] = IdentifierName;
  __l._M_len = 0x12;
  __l._M_array = local_1a8;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            ((vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)&local_218,__l,
             &local_21a);
  preamble_clean((vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)&local_200,
                 (vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)&local_218);
  pEVar1 = Expectation::AST(&local_180,
                            (vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
                            &local_200);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,
             "\nint _ ( )\n{\n    x y ;\n    x * z ;\n    x * z ;\n    x . m ;\n}\n",&local_21b);
  pEVar1 = Expectation::ambiguity(pEVar1,&local_1e8);
  Expectation::Expectation(&local_c8,pEVar1);
  reparse_withSyntaxCorrelation(this,&local_1c8,&local_c8);
  Expectation::~Expectation(&local_c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~_Vector_base
            (&local_200);
  std::_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~_Vector_base
            (&local_218);
  Expectation::~Expectation(&local_180);
  std::__cxx11::string::~string((string *)&local_1c8);
  return;
}

Assistant:

void ReparserTester::case0027()
{
    // Source-code with error.

    auto s = R"(
int _ ( )
{
    x y ;
    x * z ;
    x . m ;
}
)";

    reparse_withSyntaxCorrelation(
                s,
                Expectation().AST(
                    preamble_clean(
                        { SyntaxKind::DeclarationStatement,
                          SyntaxKind::VariableAndOrFunctionDeclaration,
                          SyntaxKind::TypedefName,
                          SyntaxKind::IdentifierDeclarator,
                          SyntaxKind::AmbiguousMultiplicationOrPointerDeclaration,
                          SyntaxKind::DeclarationStatement,
                          SyntaxKind::VariableAndOrFunctionDeclaration,
                          SyntaxKind::TypedefName,
                          SyntaxKind::PointerDeclarator,
                          SyntaxKind::IdentifierDeclarator,
                          SyntaxKind::ExpressionStatement,
                          SyntaxKind::MultiplyExpression,
                          SyntaxKind::IdentifierName,
                          SyntaxKind::IdentifierName,
                          SyntaxKind::ExpressionStatement,
                          SyntaxKind::DirectMemberAccessExpression,
                          SyntaxKind::IdentifierName,
                          SyntaxKind::IdentifierName }))
                .ambiguity(R"(
int _ ( )
{
    x y ;
    x * z ;
    x * z ;
    x . m ;
}
)"));

}